

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::TargetMissMatchTest::TargetMissMatchTest
          (TargetMissMatchTest *this,Context *context)

{
  GLenum GVar1;
  GLenum dst_target;
  GLuint target;
  long lVar2;
  uint uVar3;
  long lVar4;
  testCase test_case;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"target_miss_match",
             "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TargetMissMatchTest_01dbcc78;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_test_cases).
  super__Vector_base<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  for (lVar2 = 0; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    GVar1 = (&s_valid_targets)[lVar2];
    uVar3 = 0xfffffffb;
    for (lVar4 = 0; lVar4 != 0x2c; lVar4 = lVar4 + 4) {
      test_case.m_dst_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      test_case.m_expected_result = 0x500;
      if (lVar4 != 0 && lVar2 != 0) {
        if (test_case.m_dst_target == GVar1) {
          test_case.m_expected_result = 0;
        }
        if (uVar3 < 2 == (int)lVar2 - 5U < 2) {
          test_case.m_tex_target = GVar1;
          test_case.m_src_target = GVar1;
          std::
          vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,&test_case);
        }
      }
      uVar3 = uVar3 + 1;
    }
  }
  for (lVar2 = 0; lVar2 != 0xb; lVar2 = lVar2 + 1) {
    GVar1 = (&s_valid_targets)[lVar2];
    uVar3 = 0xfffffffb;
    for (lVar4 = 0; lVar4 != 0x2c; lVar4 = lVar4 + 4) {
      test_case.m_src_target = *(GLenum *)((long)&s_valid_targets + lVar4);
      test_case.m_expected_result = 0x500;
      if (lVar4 != 0 && lVar2 != 0) {
        if (test_case.m_src_target == GVar1) {
          test_case.m_expected_result = 0;
        }
        if (uVar3 < 2 == (int)lVar2 - 5U < 2) {
          test_case.m_tex_target = GVar1;
          test_case.m_dst_target = GVar1;
          std::
          vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,&test_case);
        }
      }
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

TargetMissMatchTest::TargetMissMatchTest(deqp::Context& context)
	: TestCase(
		  context, "target_miss_match",
		  "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Wrong dst target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum dst_target = s_valid_targets[dst];
			const GLenum src_target = s_valid_targets[target];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (dst_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Wrong src target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint src = 0; src < s_n_valid_targets; ++src)
		{
			const GLenum dst_target = s_valid_targets[target];
			const GLenum src_target = s_valid_targets[src];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (src_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}
}